

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

void __thiscall
google::protobuf::io::EpsCopyOutputStream::EpsCopyOutputStream
          (EpsCopyOutputStream *this,void *data,int size,ZeroCopyOutputStream *stream,
          bool deterministic,uint8_t **pp)

{
  uint8_t *puVar1;
  uint8_t **pp_local;
  bool deterministic_local;
  ZeroCopyOutputStream *stream_local;
  int size_local;
  void *data_local;
  EpsCopyOutputStream *this_local;
  
  this->buffer_end_ = this->buffer_;
  this->stream_ = stream;
  this->had_error_ = false;
  this->aliasing_enabled_ = false;
  this->is_serialization_deterministic_ = deterministic;
  this->skip_check_consistency = false;
  puVar1 = SetInitialBuffer(this,data,size);
  *pp = puVar1;
  return;
}

Assistant:

EpsCopyOutputStream(void* data, int size, ZeroCopyOutputStream* stream,
                      bool deterministic, uint8_t** pp)
      : stream_(stream), is_serialization_deterministic_(deterministic) {
    *pp = SetInitialBuffer(data, size);
  }